

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Image_Function_Helper::ProjectionProfile
          (ProjectionProfileForm4 projectionProfile,Image *image,uint32_t x,uint32_t y,
          uint32_t width,uint32_t height,bool horizontal)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  code *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  byte in_stack_00000010;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *projection;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  
  pvVar1 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10d7f7);
  (*in_RSI)(in_RDX,in_ECX,in_R8D,in_R9D,in_stack_00000008,in_stack_00000010 & 1,pvVar1);
  return in_RDI;
}

Assistant:

std::vector < uint32_t > ProjectionProfile( FunctionTable::ProjectionProfileForm4 projectionProfile,
                                                const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal )
    {
        std::vector < uint32_t > projection;

        projectionProfile( image, x, y, width, height, horizontal, projection );

        return projection;
    }